

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O1

void __thiscall duckdb::ReservoirSample::Vacuum(ReservoirSample *this)

{
  long lVar1;
  _Head_base<0UL,_duckdb::ReservoirChunk_*,_false> __p;
  idx_t iVar2;
  pointer pRVar3;
  pointer pRVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  double dVar9;
  unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
  ret_reservoir;
  unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> ret;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> local_20;
  __uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_> local_18;
  
  if (this->stats_sample == false) {
    iVar2 = GetActiveSampleCount(this);
    uVar5 = this->sample_count;
    uVar6 = 0x800;
    if (uVar5 < 0x800) {
      uVar6 = uVar5;
    }
    lVar1 = uVar5 + (uVar6 * 5 & 0xffffffff) * 2;
    auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar8._0_8_ = lVar1;
    auVar8._12_4_ = 0x45300000;
    dVar9 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 0.8;
    uVar5 = (ulong)dVar9;
    if (iVar2 <= ((long)(dVar9 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5))
    goto LAB_00c36f69;
  }
  if ((this->reservoir_chunk).
      super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
      .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl == (ReservoirChunk *)0x0)
  {
    bVar7 = false;
  }
  else {
    pRVar3 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(&this->reservoir_chunk);
    bVar7 = 0x800 < (pRVar3->chunk).count;
  }
  if (!bVar7) {
    return;
  }
  if ((this->reservoir_chunk).
      super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
      .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl == (ReservoirChunk *)0x0)
  {
    return;
  }
  if ((this->super_BlockingSample).destroyed != false) {
    return;
  }
LAB_00c36f69:
  (*(this->super_BlockingSample)._vptr_BlockingSample[3])(&local_18,this);
  local_20._M_head_impl =
       (ReservoirSample *)
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
       .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>.
  super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl =
       (tuple<duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>)
       (_Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>)
       0x0;
  pRVar4 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_20);
  __p._M_head_impl =
       (pRVar4->reservoir_chunk).
       super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
       super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
       .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl;
  (pRVar4->reservoir_chunk).
  super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>.
  super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl = (ReservoirChunk *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
  reset((__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> *)
        &this->reservoir_chunk,__p._M_head_impl);
  pRVar4 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_20);
  SelectionVector::operator=(&this->sel,&pRVar4->sel);
  pRVar4 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_20);
  this->sel_size = pRVar4->sel_size;
  if (local_20._M_head_impl != (ReservoirSample *)0x0) {
    (*((local_20._M_head_impl)->super_BlockingSample)._vptr_BlockingSample[1])();
  }
  if (local_18._M_t.
      super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
      .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>)
      0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
                          .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl + 8)
    )();
  }
  return;
}

Assistant:

void ReservoirSample::Vacuum() {
	Verify();
	bool do_vacuum = false;
	// when it's not a stats sample, sometimes we neverr collect more than FIXED_SAMPLE_SIZE tuples
	// but we still need to vacuum, so the rules are a little bit different.
	if (!stats_sample && GetActiveSampleCount() <= static_cast<idx_t>(GetReservoirChunkCapacity<double>() * 0.8)) {
		do_vacuum = true;
	}
	if (!do_vacuum && (NumSamplesCollected() <= FIXED_SAMPLE_SIZE || !reservoir_chunk || destroyed)) {
		// sample is destroyed or too small to shrink
		// sample does not need to be vacuumed.
		return;
	}

	auto ret = Copy();
	auto ret_reservoir = duckdb::unique_ptr_cast<BlockingSample, ReservoirSample>(std::move(ret));
	reservoir_chunk = std::move(ret_reservoir->reservoir_chunk);
	sel = std::move(ret_reservoir->sel);
	sel_size = ret_reservoir->sel_size;

	Verify();
	// We should only have one sample chunk now.
	D_ASSERT(Chunk().size() > 0 && Chunk().size() <= sample_count);
}